

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::BufferedFile::fileno(BufferedFile *this,FILE *__stream)

{
  int iVar1;
  SystemError *this_00;
  int *piVar2;
  
  iVar1 = ::fileno((FILE *)this->file_);
  if (iVar1 != -1) {
    return iVar1;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError(this_00,*piVar2,(CStringRef)0x17823f);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

int fmt::BufferedFile::fileno() const {
  int fd = FMT_POSIX_CALL(fileno FMT_ARGS(file_));
  if (fd == -1)
    FMT_THROW(SystemError(errno, "cannot get file descriptor"));
  return fd;
}